

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesarray.hpp
# Opt level: O1

void __thiscall
bal::VariablesArray::assign_element
          (VariablesArray *this,literalid_t *src,variableid_t src_size,variableid_t index)

{
  variableid_t vVar1;
  
  vVar1 = this->element_size_;
  if (vVar1 != src_size) {
    __assert_fail("src_size == element_size_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesarray.hpp"
                  ,0x6d,
                  "void bal::VariablesArray::assign_element(const literalid_t *const, const variableid_t, const variableid_t)"
                 );
  }
  if ((index + 1) * vVar1 <= (this->super_Container<unsigned_int>).size_) {
    if (src_size != 0) {
      memmove((this->super_Container<unsigned_int>).data_ + vVar1 * index,src,(ulong)src_size << 2);
      return;
    }
    return;
  }
  __assert_fail("(index + 1) * element_size_ <= size_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesarray.hpp"
                ,0x6e,
                "void bal::VariablesArray::assign_element(const literalid_t *const, const variableid_t, const variableid_t)"
               );
}

Assistant:

void assign_element(const literalid_t* const src, const variableid_t src_size, const variableid_t index) {
            assert(src_size == element_size_);
            assert((index + 1) * element_size_ <= size_);
            std::copy(src, src + src_size, data_ + (index * element_size_));
        }